

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONPackagePresets.cxx
# Opt level: O1

ReadFileResult
cmCMakePresetsGraphInternal::PackagePresetsHelper
          (vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::PackagePreset> *in_R8;
  Value *local_40;
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
  local_38;
  undefined5 uStack_20;
  undefined3 local_1b;
  undefined5 uStack_18;
  
  if (PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
      ::vector(&local_38,
               (vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
                *)(anonymous_namespace)::PackagePresetHelper);
      uStack_18 = (anonymous_namespace)::PackagePresetHelper._32_5_;
      uStack_20 = (anonymous_namespace)::PackagePresetHelper._24_5_;
      local_1b = (anonymous_namespace)::PackagePresetHelper._29_3_;
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>>
                (&PackagePresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&local_38,in_R8);
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
      ::~vector(&local_38);
      __cxa_atexit(std::_Function_base::~_Function_base,&PackagePresetsHelper::helper,&__dso_handle)
      ;
      __cxa_guard_release(&PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  local_40 = value;
  if (PackagePresetsHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*PackagePresetsHelper::helper._M_invoker)
                      ((_Any_data *)&PackagePresetsHelper::helper,out,&local_40);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PackagePresetsHelper(
  std::vector<cmCMakePresetsGraph::PackagePreset>& out,
  const Json::Value* value)
{
  static auto const helper =
    cmJSONHelperBuilder<ReadFileResult>::Vector<PackagePreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
      PackagePresetHelper);

  return helper(out, value);
}